

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O1

ImageNavigationHeader *
lrit::getHeader<lrit::ImageNavigationHeader>
          (ImageNavigationHeader *__return_storage_ptr__,Buffer *b,int pos)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  undefined4 uVar4;
  size_t sVar5;
  ushort uVar6;
  size_t sVar7;
  HeaderReader<lrit::ImageNavigationHeader> r;
  char projectionName [32];
  string local_e0;
  Buffer *local_c0;
  int local_b8;
  undefined4 local_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined8 local_88;
  undefined8 uStack_80;
  string local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_a0 = 0;
  local_98 = 0;
  puVar2 = (b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_b0 = CONCAT31(local_b0._1_3_,puVar2[pos]);
  uVar6 = *(ushort *)(puVar2 + (pos + 1));
  uVar6 = uVar6 << 8 | uVar6 >> 8;
  local_b0 = CONCAT22(uVar6,(undefined2)local_b0);
  uVar4 = local_b0;
  local_b8 = pos + 3;
  __return_storage_ptr__->headerType = (undefined1)local_b0;
  __return_storage_ptr__->field_0x1 = local_b0._1_1_;
  __return_storage_ptr__->headerLength = uVar6;
  (__return_storage_ptr__->projectionName)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->projectionName).field_2;
  local_c0 = b;
  local_b0 = uVar4;
  local_a8 = &local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->projectionName,&local_98,&local_98);
  __return_storage_ptr__->columnScaling = (undefined4)local_88;
  __return_storage_ptr__->lineScaling = local_88._4_4_;
  __return_storage_ptr__->columnOffset = (undefined4)uStack_80;
  __return_storage_ptr__->lineOffset = uStack_80._4_4_;
  puVar3 = (local_c0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = puVar3 + local_b8;
  local_58 = *(undefined8 *)puVar2;
  uStack_50 = *(undefined8 *)(puVar2 + 8);
  puVar3 = puVar3 + (long)local_b8 + 0x10;
  local_48 = *(undefined8 *)puVar3;
  uStack_40 = *(undefined8 *)(puVar3 + 8);
  local_b8 = local_b8 + 0x20;
  sVar5 = strlen((char *)&local_58);
  sVar7 = 0x20;
  if (sVar5 < 0x20) {
    sVar7 = sVar5;
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,&local_58,(long)&local_58 + sVar7);
  util::trimRight(&local_78,&local_e0);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->projectionName,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  puVar2 = (local_c0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = *(uint *)(puVar2 + local_b8);
  __return_storage_ptr__->columnScaling =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = *(uint *)(puVar2 + (local_b8 + 4));
  __return_storage_ptr__->lineScaling =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = *(uint *)(puVar2 + (local_b8 + 8));
  __return_storage_ptr__->columnOffset =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = *(uint *)(puVar2 + (local_b8 + 0xc));
  __return_storage_ptr__->lineOffset =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  local_b8 = local_b8 + 0x10;
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ImageNavigationHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<ImageNavigationHeader>(b, pos);
  auto h = r.getHeader();

  // Read 32 bytes for the projection name
  char projectionName[32];
  r.read(projectionName, sizeof(projectionName));

  // Convert to std::string for return value
  h.projectionName = util::trimRight(std::string(
      projectionName,
      std::min(strlen(projectionName), sizeof(projectionName))));

  r.read(&h.columnScaling);
  r.read(&h.lineScaling);
  r.read(&h.columnOffset);
  r.read(&h.lineOffset);
  return h;
}